

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression *
soul::ExpressionHelpers::fromIdentifier(Expression *__return_storage_ptr__,QualifiedIdentifier *q)

{
  pointer pPVar1;
  int iVar2;
  ExpressionHelpers *this;
  Scope *pSVar3;
  IdentifierPath *partialName;
  Scope *p;
  bool bVar4;
  string text;
  string resolvedUID;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  Identifier *local_80;
  size_t local_78;
  Ptr local_70;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  IdentifierPath::toString_abi_cxx11_
            (&local_140,
             &((q->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  iVar2 = std::__cxx11::string::compare((char *)&local_140);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_140), iVar2 == 0)) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_140._M_dataplus._M_p,
               local_140._M_dataplus._M_p + local_140._M_string_length);
    createPrimitive(__return_storage_ptr__,&local_a0);
    local_120._M_dataplus._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_00266401;
  }
  else {
    pPVar1 = (q->pathSections).
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(q->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 0x60) &&
       ((pPVar1->specialisationArgs).object == (Expression *)0x0)) {
      pSVar3 = (q->super_Expression).super_Statement.super_ASTObject.context.parentScope;
      bVar4 = false;
      partialName = (IdentifierPath *)0x60;
      do {
        iVar2 = (*pSVar3->_vptr_Scope[5])(pSVar3);
        this = (ExpressionHelpers *)CONCAT44(extraout_var,iVar2);
        if (this != (ExpressionHelpers *)0x0) {
          if (!bVar4) goto LAB_00266468;
          break;
        }
        iVar2 = (*pSVar3->_vptr_Scope[4])(pSVar3);
        pSVar3 = (Scope *)CONCAT44(extraout_var_00,iVar2);
        bVar4 = pSVar3 == (Scope *)0x0;
      } while (!bVar4);
      this = (ExpressionHelpers *)0x0;
LAB_00266468:
      if (this != (ExpressionHelpers *)0x0) {
        IdentifierPath::operator+
                  ((IdentifierPath *)&stack0xffffffffffffff80,&q->pathPrefix,
                   &((q->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_start)->path);
        resolvePartialNameAsUID_abi_cxx11_
                  (&local_120,this,(ModuleBase *)&stack0xffffffffffffff80,partialName);
        local_78 = 0;
        if ((SourceCodeText *)0x8 < local_70.object) {
          if (local_80 != (Identifier *)0x0) {
            operator_delete__(local_80);
          }
          local_80 = (Identifier *)&stack0xffffffffffffff98;
          local_70.object = (SourceCodeText *)0x8;
        }
        if (local_120._M_string_length != 0) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_140._M_dataplus._M_p,
                     local_140._M_dataplus._M_p + local_140._M_string_length);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,local_120._M_dataplus._M_p,
                     local_120._M_dataplus._M_p + local_120._M_string_length);
          createStruct(__return_storage_ptr__,&local_c0,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_a0.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p == &local_120.field_2) goto LAB_00266401;
          goto LAB_002663f9;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_140._M_dataplus._M_p,
               local_140._M_dataplus._M_p + local_140._M_string_length);
    createText(__return_storage_ptr__,&local_100);
    local_a0.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
    local_120._M_dataplus._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_00266401;
  }
LAB_002663f9:
  operator_delete(local_120._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
LAB_00266401:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression fromIdentifier (AST::QualifiedIdentifier& q)
    {
        auto text = q.toString();

        if (text == "wrap" || text == "clamp")
            return createPrimitive (text);

        if (q.isSimplePath())
        {
            if (auto parentModule = q.getParentScope()->findModule())
            {
                auto resolvedUID = resolvePartialNameAsUID (*parentModule, q.getPath());

                if (! resolvedUID.empty())
                    return createStruct (text, resolvedUID);
            }
        }

        return createText (text);
    }